

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

void slot_write20(opl_slot *slot,Bit8u data)

{
  slot->trem = (Bit8u *)(slot->chip->mixbuff + (ulong)(-1 < (char)data) * 2 + -3);
  slot->reg_vib = data >> 6 & 1;
  slot->reg_type = data >> 5 & 1;
  slot->reg_ksr = data >> 4 & 1;
  slot->reg_mult = data & 0xf;
  envelope_update_rate(slot);
  return;
}

Assistant:

void slot_write20(opl_slot *slot, Bit8u data) {
	if ((data >> 7) & 0x01) {
		slot->trem = &slot->chip->tremval;
	}
	else {
		slot->trem = (Bit8u*)&slot->chip->zeromod;
	}
	slot->reg_vib = (data >> 6) & 0x01;
	slot->reg_type = (data >> 5) & 0x01;
	slot->reg_ksr = (data >> 4) & 0x01;
	slot->reg_mult = data & 0x0f;
	envelope_update_rate(slot);
}